

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O2

REF_STATUS
ref_import_meshb_contents(char *filename,REF_BOOL *has_association,REF_BOOL *has_geometry_model)

{
  uint uVar1;
  REF_INT version;
  REF_FILEPOS key_pos [156];
  REF_INT local_4fc;
  REF_FILEPOS local_4f8 [40];
  ulong local_3b8;
  ulong local_3b0;
  ulong local_3a8;
  long local_108;
  
  uVar1 = ref_import_meshb_header(filename,&local_4fc,local_4f8);
  if (uVar1 == 0) {
    *has_association = (uint)((local_3b0 & local_3b8 & local_3a8) != 0xffffffffffffffff);
    *has_geometry_model = (uint)(local_108 != -1);
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",0x5f4,
           "ref_import_meshb_contents",(ulong)uVar1,"header");
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_import_meshb_contents(const char *filename,
                                             REF_BOOL *has_association,
                                             REF_BOOL *has_geometry_model) {
  REF_INT version;
  REF_FILEPOS key_pos[REF_IMPORT_MESHB_LAST_KEYWORD];
  REF_INT node_keyword = 40;
  REF_INT edge_keyword = 41;
  REF_INT face_keyword = 42;
  REF_INT cad_data_keyword = 126; /* GmfByteFlow */
  RSS(ref_import_meshb_header(filename, &version, key_pos), "header");
  *has_association = ((REF_FILEPOS)REF_EMPTY != key_pos[node_keyword]) ||
                     ((REF_FILEPOS)REF_EMPTY != key_pos[edge_keyword]) ||
                     ((REF_FILEPOS)REF_EMPTY != key_pos[face_keyword]);
  *has_geometry_model = ((REF_FILEPOS)REF_EMPTY != key_pos[cad_data_keyword]);
  return REF_SUCCESS;
}